

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi.cpp
# Opt level: O3

void opn2_setChannelAllocMode(OPN2_MIDIPlayer *device,int chanalloc)

{
  int iVar1;
  
  if (device != (OPN2_MIDIPlayer *)0x0) {
    if (device->opn2_midiPlayer == (void *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/opnmidi.cpp"
                    ,0x1f1,"void opn2_setChannelAllocMode(struct OPN2_MIDIPlayer *, int)");
    }
    iVar1 = -1;
    if (0xfffffffb < chanalloc - 3U) {
      iVar1 = chanalloc;
    }
    *(int *)(*(long *)((long)device->opn2_midiPlayer + 400) + 0xe0) = iVar1;
  }
  return;
}

Assistant:

OPNMIDI_EXPORT void opn2_setChannelAllocMode(struct OPN2_MIDIPlayer *device, int chanalloc)
{
    if(!device)
        return;
    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    Synth &synth = *play->m_synth;
    if(chanalloc < -1 || chanalloc >= OPNMIDI_ChanAlloc_Count)
        chanalloc = OPNMIDI_ChanAlloc_AUTO;
    synth.m_channelAlloc = static_cast<OPNMIDI_ChannelAlloc>(chanalloc);
}